

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.h
# Opt level: O2

void __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::TextbookBoyerMoore(TextbookBoyerMoore<char16_t> *this)

{
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::CharMap(&this->lastOccurrence,-1);
  (this->goodSuffix).ptr = (int *)0x0;
  return;
}

Assistant:

inline TextbookBoyerMoore() : lastOccurrence(-1), goodSuffix(nullptr) {}